

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O0

bool __thiscall
Minisat::SimpSolver::merge
          (SimpSolver *this,Clause *_ps,Clause *_qs,Var v,vec<Minisat::Lit> *out_clause)

{
  unsigned_long uVar1;
  int iVar2;
  Lit LVar3;
  unsigned_long *puVar4;
  int in_ECX;
  Clause *in_RDX;
  Clause *in_RSI;
  long in_RDI;
  vec<Minisat::Lit> *in_R8;
  int i_1;
  int i;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  vec<Minisat::Lit> *in_stack_ffffffffffffff60;
  vec<Minisat::Lit> *this_00;
  int local_44;
  int local_34;
  
  *(int *)(in_RDI + 0x1420) = *(int *)(in_RDI + 0x1420) + 1;
  vec<Minisat::Lit>::clear(in_stack_ffffffffffffff60,(bool)in_stack_ffffffffffffff5f);
  *(long *)(in_RDI + 0x5d0) = *(long *)(in_RDI + 0x5d0) + 1;
  for (local_34 = 0; iVar2 = Clause::size(in_RSI), local_34 < iVar2; local_34 = local_34 + 1) {
    LVar3 = Clause::operator[](in_RSI,local_34);
    iVar2 = var(LVar3);
    if (iVar2 != in_ECX) {
      Clause::operator[](in_RSI,local_34);
      vec<Minisat::Lit>::push
                (in_stack_ffffffffffffff60,
                 (Lit *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      uVar1 = *(unsigned_long *)(in_RDI + 0x5d0);
      LVar3 = Clause::operator[](in_RSI,local_34);
      puVar4 = vec<unsigned_long>::operator[]((vec<unsigned_long> *)(in_RDI + 0x5c0),LVar3.x);
      *puVar4 = uVar1;
    }
  }
  local_44 = 0;
  do {
    iVar2 = Clause::size(in_RDX);
    if (iVar2 <= local_44) {
      return true;
    }
    LVar3 = Clause::operator[](in_RDX,local_44);
    iVar2 = var(LVar3);
    if (iVar2 != in_ECX) {
      LVar3 = Clause::operator[](in_RDX,local_44);
      puVar4 = vec<unsigned_long>::operator[]((vec<unsigned_long> *)(in_RDI + 0x5c0),LVar3.x);
      if (*puVar4 != *(unsigned_long *)(in_RDI + 0x5d0)) {
        LVar3 = Clause::operator[](in_RDX,local_44);
        LVar3 = operator~(LVar3);
        puVar4 = vec<unsigned_long>::operator[]((vec<unsigned_long> *)(in_RDI + 0x5c0),LVar3.x);
        if (*puVar4 == *(unsigned_long *)(in_RDI + 0x5d0)) {
          return false;
        }
        this_00 = in_R8;
        Clause::operator[](in_RDX,local_44);
        vec<Minisat::Lit>::push
                  (this_00,(Lit *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      }
    }
    local_44 = local_44 + 1;
  } while( true );
}

Assistant:

bool SimpSolver::merge(const Clause &_ps, const Clause &_qs, Var v, vec<Lit> &out_clause)
{
    merges++;
    out_clause.clear();
    counter++;

    for (int i = 0; i < _ps.size(); i++) {
        if (var(_ps[i]) != v) {
            out_clause.push(_ps[i]);
            seen2[_ps[i].x] = counter;
        }
    }

    for (int i = 0; i < _qs.size(); i++) {
        if (var(_qs[i]) != v) {
            if (seen2[_qs[i].x] != counter) {
                if (seen2[(~_qs[i]).x] != counter) {
                    out_clause.push(_qs[i]);
                } else {
                    return false;
                }
            }
        }
    }

    return true;
}